

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatOrderH.c
# Opt level: O1

int Msat_OrderVarSelect(Msat_Order_t *p)

{
  double dVar1;
  int iVar2;
  Msat_IntVec_t *pMVar3;
  int *piVar4;
  int *piVar5;
  double *pdVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  timespec ts;
  timespec local_30;
  
  iVar7 = clock_gettime(3,&local_30);
  if (iVar7 < 0) {
    lVar9 = 1;
  }
  else {
    lVar9 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_30.tv_nsec),8);
    lVar9 = ((lVar9 >> 7) - (lVar9 >> 0x3f)) + local_30.tv_sec * -1000000;
  }
  do {
    pMVar3 = p->vHeap;
    if (pMVar3->nSize == 1) {
      return -3;
    }
    iVar7 = pMVar3->pArray[1];
    iVar8 = Msat_IntVecPop(pMVar3);
    pMVar3 = p->vHeap;
    piVar4 = pMVar3->pArray;
    piVar4[1] = iVar8;
    piVar5 = p->vIndex->pArray;
    piVar5[iVar8] = 1;
    piVar5[iVar7] = 0;
    iVar8 = pMVar3->nSize;
    if (1 < iVar8) {
      iVar2 = piVar4[1];
      uVar12 = 1;
      if (iVar8 != 2) {
        pdVar6 = p->pSat->pdActivity;
        dVar1 = pdVar6[iVar2];
        uVar13 = 2;
        uVar12 = 1;
        do {
          uVar11 = uVar13 | 1;
          if ((iVar8 <= (int)uVar11) ||
             (pdVar6[piVar4[(int)uVar11]] < pdVar6[piVar4[(int)uVar13]] ||
              pdVar6[piVar4[(int)uVar11]] == pdVar6[piVar4[(int)uVar13]])) {
            uVar11 = uVar13;
          }
          iVar8 = piVar4[(int)uVar11];
          if (pdVar6[iVar8] <= dVar1) break;
          piVar4[(int)uVar12] = iVar8;
          piVar5[iVar8] = uVar12;
          uVar13 = uVar11 * 2;
          iVar8 = pMVar3->nSize;
          uVar12 = uVar11;
        } while ((int)uVar13 < iVar8);
      }
      piVar4[(int)uVar12] = iVar2;
      piVar5[iVar2] = uVar12;
    }
    if (p->pSat->pAssigns[iVar7] == -1) {
      iVar8 = clock_gettime(3,&local_30);
      if (iVar8 < 0) {
        lVar10 = -1;
      }
      else {
        lVar10 = local_30.tv_nsec / 1000 + local_30.tv_sec * 1000000;
      }
      timeSelect = timeSelect + lVar10 + lVar9;
      return iVar7;
    }
  } while( true );
}

Assistant:

int Msat_OrderVarSelect( Msat_Order_t * p )
{
    // Activity based decision:
//    while (!heap.empty()){
//        Var next = heap.getmin();
//        if (toLbool(assigns[next]) == l_Undef)
//            return next;
//    }
//    return var_Undef;

    int Var;
    abctime clk = Abc_Clock();

    while ( !HEMPTY(p) )
    {
        Var = Msat_HeapGetTop(p);
        if ( (p)->pSat->pAssigns[Var] == MSAT_VAR_UNASSIGNED )
        {
//assert( Msat_OrderCheck(p) );
timeSelect += Abc_Clock() - clk;
            return Var;
        }
    }
    return MSAT_ORDER_UNKNOWN;
}